

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::LogErrorCase::iterate(LogErrorCase *this)

{
  ResultCollector *results;
  FuncType FVar1;
  Context *pCVar2;
  CoreTestFunc p_Var3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  GLint numMsg;
  DebugMessageTestContext context;
  undefined4 local_6c;
  NegativeTestContext local_68;
  LogErrorCase *local_28;
  long lVar6;
  
  bVar4 = isKHRDebugSupported((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context);
  if (bVar4) {
    iVar5 = (*((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    lVar6 = CONCAT44(extraout_var,iVar5);
    pCVar2 = (this->super_BaseCase).super_ErrorCase.super_TestCase.m_context;
    results = &(this->super_BaseCase).m_results;
    NegativeTestShared::NegativeTestContext::NegativeTestContext
              (&local_68,(ErrorCase *)this,pCVar2->m_renderCtx,pCVar2->m_contextInfo,
               ((this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log,results,true);
    local_6c = 0;
    local_28 = this;
    (**(code **)(lVar6 + 0x5e0))(0x92e0);
    (**(code **)(lVar6 + 0x5e0))(0x8242);
    (**(code **)(lVar6 + 0x428))(0x1100,0x1100,0x1100,0,0,0);
    (**(code **)(lVar6 + 0x428))(0x8246,0x824c,0x1100,0,0,1);
    (**(code **)(lVar6 + 0x420))(0,0);
    (**(code **)(lVar6 + 0x868))(0x9145,&local_6c);
    (**(code **)(lVar6 + 0x7e0))(local_6c,0,0,0,0,0,0,0);
    FVar1 = (this->m_errorFunc).m_type;
    p_Var3 = (this->m_errorFunc).m_func.coreFn;
    if (FVar1 == TYPE_DEBUG) {
      (*p_Var3)(&local_68);
    }
    else if (FVar1 == TYPE_CORE) {
      (*p_Var3)(&local_68);
    }
    (**(code **)(lVar6 + 0x4e8))(0x92e0);
    tcu::ResultCollector::setTestContextResult
              (results,(this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx);
    NegativeTestShared::NegativeTestContext::~NegativeTestContext(&local_68);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
             ,0x2d8);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

LogErrorCase::IterateResult LogErrorCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	tcu::TestLog&			log		= m_testCtx.getLog();
	DebugMessageTestContext	context	= DebugMessageTestContext(*this, m_context.getRenderContext(), m_context.getContextInfo(), log, m_results, true);
	GLint					numMsg	= 0;

	gl.enable(GL_DEBUG_OUTPUT);
	gl.enable(GL_DEBUG_OUTPUT_SYNCHRONOUS);
	gl.debugMessageControl(GL_DONT_CARE, GL_DONT_CARE, GL_DONT_CARE, 0, DE_NULL, false); // disable all
	gl.debugMessageControl(GL_DEBUG_SOURCE_API, GL_DEBUG_TYPE_ERROR, GL_DONT_CARE, 0, DE_NULL, true); // enable API errors
	gl.debugMessageCallback(DE_NULL, DE_NULL); // enable logging
	gl.getIntegerv(GL_DEBUG_LOGGED_MESSAGES, &numMsg);
	gl.getDebugMessageLog(numMsg, 0, DE_NULL, DE_NULL, DE_NULL, DE_NULL, DE_NULL, DE_NULL); // clear log

	m_errorFunc.call(context);

	gl.disable(GL_DEBUG_OUTPUT);
	m_results.setTestContextResult(m_testCtx);

	return STOP;
}